

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

void __thiscall
Js::ExternalArrayBuffer::ExtractSnapObjectDataInto
          (ExternalArrayBuffer *this,SnapObject *objData,SlabAllocator *alloc)

{
  byte *__dest;
  uint32 uVar1;
  int iVar2;
  SnapArrayBufferInfo *addtlInfo;
  uchar *puVar3;
  undefined4 extraout_var;
  SnapArrayBufferInfo *sabi;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  ExternalArrayBuffer *this_local;
  
  addtlInfo = TTD::SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapArrayBufferInfo>
                        (alloc);
  uVar1 = (*(this->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  addtlInfo->Length = uVar1;
  if (addtlInfo->Length == 0) {
    addtlInfo->Buff = (byte *)0x0;
  }
  else {
    puVar3 = TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>
                       (alloc,(ulong)addtlInfo->Length);
    addtlInfo->Buff = puVar3;
    __dest = addtlInfo->Buff;
    iVar2 = (*(this->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])();
    memcpy(__dest,(void *)CONCAT44(extraout_var,iVar2),(ulong)addtlInfo->Length);
  }
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapArrayBufferInfo*,(TTD::NSSnapObjects::SnapObjectType)23>
            (objData,addtlInfo);
  return;
}

Assistant:

void ExternalArrayBuffer::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapArrayBufferInfo* sabi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapArrayBufferInfo>();

        sabi->Length = this->GetByteLength();
        if(sabi->Length == 0)
        {
            sabi->Buff = nullptr;
        }
        else
        {
            sabi->Buff = alloc.SlabAllocateArray<byte>(sabi->Length);
            memcpy(sabi->Buff, this->GetBuffer(), sabi->Length);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapArrayBufferInfo*, TTD::NSSnapObjects::SnapObjectType::SnapArrayBufferObject>(objData, sabi);
    }